

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwSetInputMode(GLFWwindow *handle,int mode,int value)

{
  uint uVar1;
  GLFWbool GVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  int i_1;
  int i;
  _GLFWwindow *window;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar3;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (in_ESI == 0x33001) {
    if (((in_EDX == 0x34001) || (in_EDX == 0x34002)) || (in_EDX == 0x34003)) {
      if (*(uint *)(in_RDI + 0x7c) != in_EDX) {
        *(uint *)(in_RDI + 0x7c) = in_EDX;
        _glfwPlatformGetCursorPos
                  ((_GLFWwindow *)handle,(double *)CONCAT44(mode,value),(double *)window);
        _glfwPlatformSetCursorMode
                  ((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
      }
    }
    else {
      _glfwInputError(0x10003,"Invalid cursor mode 0x%08X",(ulong)in_EDX);
    }
  }
  else if (in_ESI == 0x33002) {
    uVar1 = (uint)(in_EDX != 0);
    if (*(uint *)(in_RDI + 0x70) != uVar1) {
      if (uVar1 == 0) {
        for (iVar3 = 0; iVar3 < 0x15d; iVar3 = iVar3 + 1) {
          if (*(char *)(in_RDI + 0x88 + (long)iVar3) == '\x03') {
            *(undefined1 *)(in_RDI + 0x88 + (long)iVar3) = 0;
          }
        }
      }
      *(uint *)(in_RDI + 0x70) = uVar1;
    }
  }
  else if (in_ESI == 0x33003) {
    uVar1 = (uint)(in_EDX != 0);
    if (*(uint *)(in_RDI + 0x74) != uVar1) {
      if (uVar1 == 0) {
        for (iVar3 = 0; iVar3 < 8; iVar3 = iVar3 + 1) {
          if (*(char *)(in_RDI + 0x80 + (long)iVar3) == '\x03') {
            *(undefined1 *)(in_RDI + 0x80 + (long)iVar3) = 0;
          }
        }
      }
      *(uint *)(in_RDI + 0x74) = uVar1;
    }
  }
  else if (in_ESI == 0x33004) {
    *(uint *)(in_RDI + 0x78) = (uint)(in_EDX != 0);
  }
  else if (in_ESI == 0x33005) {
    GVar2 = _glfwPlatformRawMouseMotionSupported();
    if (GVar2 == 0) {
      _glfwInputError(0x10008,"Raw mouse motion is not supported on this system");
    }
    else if (*(uint *)(in_RDI + 0x1f8) != (uint)(in_EDX != 0)) {
      *(uint *)(in_RDI + 0x1f8) = (uint)(in_EDX != 0);
      _glfwPlatformSetRawMouseMotion
                ((_GLFWwindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
    }
  }
  else {
    _glfwInputError(0x10003,"Invalid input mode 0x%08X",(ulong)in_ESI);
  }
  return;
}

Assistant:

GLFWAPI void glfwSetInputMode(GLFWwindow* handle, int mode, int value)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (mode == GLFW_CURSOR)
    {
        if (value != GLFW_CURSOR_NORMAL &&
            value != GLFW_CURSOR_HIDDEN &&
            value != GLFW_CURSOR_DISABLED)
        {
            _glfwInputError(GLFW_INVALID_ENUM,
                            "Invalid cursor mode 0x%08X",
                            value);
            return;
        }

        if (window->cursorMode == value)
            return;

        window->cursorMode = value;

        _glfwPlatformGetCursorPos(window,
                                  &window->virtualCursorPosX,
                                  &window->virtualCursorPosY);
        _glfwPlatformSetCursorMode(window, value);
    }
    else if (mode == GLFW_STICKY_KEYS)
    {
        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->stickyKeys == value)
            return;

        if (!value)
        {
            int i;

            // Release all sticky keys
            for (i = 0;  i <= GLFW_KEY_LAST;  i++)
            {
                if (window->keys[i] == _GLFW_STICK)
                    window->keys[i] = GLFW_RELEASE;
            }
        }

        window->stickyKeys = value;
    }
    else if (mode == GLFW_STICKY_MOUSE_BUTTONS)
    {
        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->stickyMouseButtons == value)
            return;

        if (!value)
        {
            int i;

            // Release all sticky mouse buttons
            for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
            {
                if (window->mouseButtons[i] == _GLFW_STICK)
                    window->mouseButtons[i] = GLFW_RELEASE;
            }
        }

        window->stickyMouseButtons = value;
    }
    else if (mode == GLFW_LOCK_KEY_MODS)
    {
        window->lockKeyMods = value ? GLFW_TRUE : GLFW_FALSE;
    }
    else if (mode == GLFW_RAW_MOUSE_MOTION)
    {
        if (!_glfwPlatformRawMouseMotionSupported())
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Raw mouse motion is not supported on this system");
            return;
        }

        value = value ? GLFW_TRUE : GLFW_FALSE;
        if (window->rawMouseMotion == value)
            return;

        window->rawMouseMotion = value;
        _glfwPlatformSetRawMouseMotion(window, value);
    }
    else
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid input mode 0x%08X", mode);
}